

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O3

void la_adsc_intermediate_projection_format_json
               (la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  la_json_append_double(ctx->vstr,"dist_nm",*data);
  la_json_append_double(ctx->vstr,"true_trk_deg",*(double *)((long)data + 8));
  la_json_append_bool(ctx->vstr,"true_trk_valid",*(char *)((long)data + 0x18) == '\0');
  la_json_append_int64(ctx->vstr,"alt",(long)*(int *)((long)data + 0x10));
  la_json_append_int64(ctx->vstr,"eta_sec",(long)*(int *)((long)data + 0x14));
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_intermediate_projection_format_json) {
	LA_UNUSED(label);
	la_adsc_intermediate_projection_t const *p = data;
	la_json_append_double(ctx->vstr, "dist_nm", p->distance);
	la_json_append_double(ctx->vstr, "true_trk_deg", p->track);
	la_json_append_bool(ctx->vstr, "true_trk_valid", p->track_invalid ? false : true);
	la_json_append_int64(ctx->vstr, "alt", p->alt);
	la_json_append_int64(ctx->vstr, "eta_sec", p->eta);
}